

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O3

bool __thiscall
BlurayHelper::createMPLSFile
          (BlurayHelper *this,TSMuxer *mainMuxer,TSMuxer *subMuxer,int autoChapterLen,
          vector<double,_std::allocator<double>_> *customChapters,DiskType dt,int mplsOffset,
          bool isMvcBaseViewR)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_color _Var4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  _Base_ptr p_Var8;
  pointer pcVar9;
  void *pvVar10;
  BlurayHelper *pBVar11;
  pointer pMVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  MPLSStreamInfo *pMVar18;
  _Base_ptr p_Var19;
  File *this_00;
  undefined8 *puVar20;
  long *plVar21;
  ulong *puVar22;
  size_type *psVar23;
  _func_int *p_Var24;
  uint8_t *puVar25;
  bool bVar26;
  char *pcVar27;
  undefined8 uVar28;
  ulong uVar29;
  const_iterator __begin2;
  double *pdVar30;
  string dstDir;
  PIDListMap pidListMVC;
  PIDListMap pidList;
  MPLSParser mplsParser;
  string prefix;
  ulong *local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  undefined8 uStack_2e0;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  long *local_298;
  ulong local_290;
  long local_288;
  undefined8 uStack_280;
  string local_278;
  ulong *local_258;
  ulong local_250;
  ulong local_248 [2];
  undefined4 local_238;
  DiskType local_234;
  undefined **local_230;
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  uint8_t *local_1e8;
  TSMuxer *local_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8 [2];
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  local_1b8;
  BlurayHelper *local_188;
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  local_180;
  undefined1 local_150 [56];
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_118;
  vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_> local_100;
  pointer local_e8 [2];
  pointer local_d8;
  int local_d0;
  bool local_cc;
  bool local_cb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_a0 [64];
  uint8_t local_60;
  
  local_234 = dt;
  local_1e0 = subMuxer;
  local_188 = this;
  TSMuxer::getFirstPts((vector<long,_std::allocator<long>_> *)local_150,mainMuxer);
  plVar21 = (long *)CONCAT44(local_150._4_4_,local_150._0_4_);
  lVar5 = *plVar21;
  operator_delete(plVar21,CONCAT44(local_150._20_4_,local_150._16_4_) - (long)plVar21);
  TSMuxer::getLastPts((vector<long,_std::allocator<long>_> *)local_150,mainMuxer);
  pvVar10 = (void *)CONCAT44(local_150._4_4_,local_150._0_4_);
  lVar6 = *(long *)(CONCAT17(local_150[0xf],
                             CONCAT16(local_150[0xe],CONCAT15(local_150[0xd],local_150._8_5_))) + -8
                   );
  if (pvVar10 != (void *)0x0) {
    operator_delete(pvVar10,CONCAT44(local_150._20_4_,local_150._16_4_) - (long)pvVar10);
  }
  local_1e8 = (uint8_t *)operator_new__(0x19000);
  MPLSParser::MPLSParser((MPLSParser *)local_150);
  local_d0 = TSMuxer::getFirstFileNum(mainMuxer);
  local_150._0_4_ = 1;
  local_150[0xd] = '\0';
  local_150._24_4_ = (undefined4)((ulong)(lVar5 - (lVar5 >> 0x3f)) >> 1);
  local_150._28_4_ = (undefined4)((ulong)(lVar6 - (lVar6 >> 0x3f)) >> 1);
  local_cb = isMvcBaseViewR;
  pdVar30 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar7 = (customChapters->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar14 = autoChapterLen;
  if (pdVar30 != pdVar7) {
    do {
      uVar13 = (uint)(long)(*pdVar30 * 45000.0);
      if (uVar13 <= (uint)(local_150._28_4_ - local_150._24_4_)) {
        local_a0._0_4_ = -1;
        local_180._M_impl._0_4_ = local_150._24_4_ + uVar13;
        std::vector<PlayListMark,std::allocator<PlayListMark>>::emplace_back<int,unsigned_int>
                  ((vector<PlayListMark,std::allocator<PlayListMark>> *)local_e8,(int *)local_a0,
                   (uint *)&local_180);
      }
      pdVar30 = pdVar30 + 1;
      iVar14 = local_150._20_4_;
    } while (pdVar30 != pdVar7);
  }
  local_150._20_4_ = iVar14;
  local_150[0xe] = false;
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::_Rb_tree(&local_180,&(mainMuxer->m_pmt).pidList._M_t);
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1b8._M_impl.super__Rb_tree_header._M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_1e0 != (TSMuxer *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
    ::operator=(&local_1b8,&(local_1e0->m_pmt).pidList._M_t);
  }
  p_Var3 = &local_180._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_180._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3) {
    local_230 = &PTR__PGSStreamReader_0023f208;
    p_Var19 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>>::emplace_back<PMTStreamInfo&>
                ((vector<MPLSStreamInfo,std::allocator<MPLSStreamInfo>> *)&local_118,
                 (PMTStreamInfo *)&p_Var19[1]._M_parent);
      pMVar12 = local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      p_Var8 = p_Var19[6]._M_right;
      if ((p_Var8 != (_Base_ptr)0x0) && (*(undefined ***)p_Var8 == local_230)) {
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].offsetId =
             *(uint8_t *)((long)&p_Var8[0xe]._M_right + 6);
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].SS_PG_offset_sequence_id =
             *(int *)&p_Var8[3].field_0x4;
        bVar26 = *(bool *)&p_Var8[2]._M_right;
        local_118.super__Vector_base<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].isSSPG = bVar26;
        if (bVar26 == true) {
          iVar14 = *(int *)((long)&p_Var8[2]._M_right + 4);
          p_Var17 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var16 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
          while (local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var17,
                (_Rb_tree_header *)p_Var16 != p_Var3) {
            if (*(int *)&p_Var16[6]._M_right[1]._M_left == iVar14) {
              local_238 = 0;
              goto LAB_00179b93;
            }
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            p_Var17 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
          }
LAB_00179b57:
          if ((_Rb_tree_header *)p_Var17 != &local_1b8._M_impl.super__Rb_tree_header) {
            if (*(int *)&p_Var17[6]._M_right[1]._M_left != iVar14) goto code_r0x00179b70;
            local_238 = (undefined4)CONCAT71((int7)((ulong)p_Var17[6]._M_right >> 8),1);
            p_Var16 = p_Var17;
LAB_00179b93:
            pMVar18 = (MPLSStreamInfo *)operator_new(0x70);
            MPLSStreamInfo::MPLSStreamInfo(pMVar18,(PMTStreamInfo *)&p_Var16[1]._M_parent);
            pMVar12[-1].leftEye = pMVar18;
            if ((char)local_238 != '\0') {
              pMVar18->type = '\x02';
            }
          }
          _Var4 = p_Var8[3]._M_color;
          p_Var17 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var16 = local_180._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var17;
            if ((_Rb_tree_header *)p_Var16 == p_Var3) {
              while ((_Rb_tree_header *)p_Var17 != &local_1b8._M_impl.super__Rb_tree_header) {
                if (*(_Rb_tree_color *)&p_Var17[6]._M_right[1]._M_left == _Var4) {
                  bVar26 = true;
                  p_Var16 = p_Var17;
                  goto LAB_00179c24;
                }
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
              }
              goto LAB_00179c4d;
            }
            if (*(_Rb_tree_color *)&p_Var16[6]._M_right[1]._M_left == _Var4) break;
            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
            p_Var17 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          bVar26 = false;
LAB_00179c24:
          pMVar18 = (MPLSStreamInfo *)operator_new(0x70);
          MPLSStreamInfo::MPLSStreamInfo(pMVar18,(PMTStreamInfo *)&p_Var16[1]._M_parent);
          pMVar12[-1].rightEye = pMVar18;
          if (bVar26) {
            pMVar18->type = '\x02';
          }
        }
      }
LAB_00179c4d:
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while ((_Rb_tree_header *)p_Var19 != p_Var3);
  }
  if ((local_1e0 != (TSMuxer *)0x0) &&
     (local_cc = true,
     (_Rb_tree_header *)local_1b8._M_impl.super__Rb_tree_header._M_header._M_left !=
     &local_1b8._M_impl.super__Rb_tree_header)) {
    p_Var19 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      MPLSStreamInfo::MPLSStreamInfo
                ((MPLSStreamInfo *)local_a0,(PMTStreamInfo *)&p_Var19[1]._M_parent);
      local_60 = '\x02';
      std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::push_back
                (&local_100,(MPLSStreamInfo *)local_a0);
      MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_a0);
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while ((_Rb_tree_header *)p_Var19 != &local_1b8._M_impl.super__Rb_tree_header);
  }
  pcVar27 = "Creating AVCHD playlist";
  if (local_234 == BLURAY) {
    pcVar27 = "Creating Blu-ray playlist";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar27,(ulong)(local_234 == BLURAY) * 2 + 0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  puVar25 = local_1e8;
  sLastMsg = true;
  iVar14 = MPLSParser::compose((MPLSParser *)local_150,local_1e8,0x19000,local_234);
  pBVar11 = local_188;
  local_a0._0_8_ = local_a0 + 0x10;
  if (local_188->m_isoWriter == (IsoWriter *)0x0) {
    pcVar9 = (local_188->m_dstPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar9,pcVar9 + (local_188->m_dstPath)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  }
  local_230 = (undefined **)CONCAT44(local_230._4_4_,iVar14);
  if (pBVar11->m_isoWriter == (IsoWriter *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
  }
  else {
    this_00 = (File *)IsoWriter::createFile(pBVar11->m_isoWriter);
  }
  paVar1 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"BDMV","");
  getDirSeparator();
  puVar20 = (undefined8 *)
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_2b8,local_2b8._M_string_length,0,'\x01');
  puVar22 = puVar20 + 2;
  if ((ulong *)*puVar20 == puVar22) {
    local_2e8 = *puVar22;
    uStack_2e0 = puVar20[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar22;
    local_2f8 = (ulong *)*puVar20;
  }
  local_2f0 = puVar20[1];
  *puVar20 = puVar22;
  puVar20[1] = 0;
  *(undefined1 *)(puVar20 + 2) = 0;
  paVar2 = &local_2d8.field_2;
  local_2d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"PLAYLIST","");
  uVar29 = 0xf;
  if (local_2f8 != &local_2e8) {
    uVar29 = local_2e8;
  }
  if (uVar29 < local_2d8._M_string_length + local_2f0) {
    uVar28 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar2) {
      uVar28 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar28 < local_2d8._M_string_length + local_2f0) goto LAB_00179ec1;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2f8);
  }
  else {
LAB_00179ec1:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_2d8._M_dataplus._M_p);
  }
  local_298 = &local_288;
  plVar21 = puVar20 + 2;
  if ((long *)*puVar20 == plVar21) {
    local_288 = *plVar21;
    uStack_280 = puVar20[3];
  }
  else {
    local_288 = *plVar21;
    local_298 = (long *)*puVar20;
  }
  local_290 = puVar20[1];
  *puVar20 = plVar21;
  puVar20[1] = 0;
  *(undefined1 *)plVar21 = 0;
  getDirSeparator();
  plVar21 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_298,local_290,0,'\x01');
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar23 = (size_type *)(plVar21 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar21 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar23) {
    local_208.field_2._M_allocated_capacity = *psVar23;
    local_208.field_2._8_8_ = plVar21[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar23;
    local_208._M_dataplus._M_p = (pointer)*plVar21;
  }
  local_208._M_string_length = plVar21[1];
  *plVar21 = (long)psVar23;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_2b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_208);
  int32ToStr_abi_cxx11_(&local_278,&mplsOffset);
  strPadLeft(&local_2d8,&local_278,5,'0');
  uVar28 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar1) {
    uVar28 = local_2b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar28 < local_2d8._M_string_length + local_2b8._M_string_length) {
    uVar28 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != paVar2) {
      uVar28 = local_2d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar28 < local_2d8._M_string_length + local_2b8._M_string_length) goto LAB_0017a07e;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
  }
  else {
LAB_0017a07e:
    puVar20 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_2d8._M_dataplus._M_p);
  }
  puVar22 = puVar20 + 2;
  if ((ulong *)*puVar20 == puVar22) {
    local_2e8 = *puVar22;
    uStack_2e0 = puVar20[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar22;
    local_2f8 = (ulong *)*puVar20;
  }
  local_2f0 = puVar20[1];
  *puVar20 = puVar22;
  puVar20[1] = 0;
  *(undefined1 *)puVar22 = 0;
  local_258 = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,".mpls","");
  uVar29 = 0xf;
  if (local_2f8 != &local_2e8) {
    uVar29 = local_2e8;
  }
  if (uVar29 < local_250 + local_2f0) {
    uVar29 = 0xf;
    if (local_258 != local_248) {
      uVar29 = local_248[0];
    }
    if (uVar29 < local_250 + local_2f0) goto LAB_0017a14b;
    puVar20 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
  }
  else {
LAB_0017a14b:
    puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_258);
  }
  plVar21 = puVar20 + 2;
  if ((long *)*puVar20 == plVar21) {
    local_288 = *plVar21;
    uStack_280 = puVar20[3];
    local_298 = &local_288;
  }
  else {
    local_288 = *plVar21;
    local_298 = (long *)*puVar20;
  }
  local_290 = puVar20[1];
  *puVar20 = plVar21;
  puVar20[1] = 0;
  *(undefined1 *)plVar21 = 0;
  iVar14 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                     (this_00,local_298,2,0);
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((char)iVar14 != '\0') {
    iVar14 = (int)local_230;
    iVar15 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                       (this_00,puVar25,(ulong)local_230 & 0xffffffff);
    p_Var24 = (this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3];
    if (iVar15 == iVar14) {
      (*p_Var24)(this_00);
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"BDMV","");
      getDirSeparator();
      plVar21 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_258,local_250,0,'\x01');
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      puVar22 = (ulong *)(plVar21 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_278.field_2._M_allocated_capacity = *puVar22;
        local_278.field_2._8_8_ = plVar21[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = *puVar22;
        local_278._M_dataplus._M_p = (pointer)*plVar21;
      }
      local_278._M_string_length = plVar21[1];
      *plVar21 = (long)puVar22;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      local_228 = local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"BACKUP","");
      uVar28 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        uVar28 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar28 < local_220 + local_278._M_string_length) {
        uVar29 = 0xf;
        if (local_228 != local_218) {
          uVar29 = local_218[0];
        }
        if (uVar29 < local_220 + local_278._M_string_length) goto LAB_0017a3c9;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_228,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
      }
      else {
LAB_0017a3c9:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_228)
        ;
      }
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      puVar22 = puVar20 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_2d8.field_2._M_allocated_capacity = *puVar22;
        local_2d8.field_2._8_8_ = puVar20[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *puVar22;
        local_2d8._M_dataplus._M_p = (pointer)*puVar20;
      }
      local_2d8._M_string_length = puVar20[1];
      *puVar20 = puVar22;
      puVar20[1] = 0;
      *(undefined1 *)puVar22 = 0;
      getDirSeparator();
      plVar21 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_2d8,local_2d8._M_string_length,0,'\x01');
      puVar22 = (ulong *)(plVar21 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar22) {
        local_2b8.field_2._M_allocated_capacity = *puVar22;
        local_2b8.field_2._8_8_ = plVar21[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *puVar22;
        local_2b8._M_dataplus._M_p = (pointer)*plVar21;
      }
      local_2b8._M_string_length = plVar21[1];
      *plVar21 = (long)puVar22;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      local_1d8 = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"PLAYLIST","");
      uVar28 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar28 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar28 < local_1d0 + local_2b8._M_string_length) {
        uVar29 = 0xf;
        if (local_1d8 != local_1c8) {
          uVar29 = local_1c8[0];
        }
        if (uVar29 < local_1d0 + local_2b8._M_string_length) goto LAB_0017a50a;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1d8,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
      }
      else {
LAB_0017a50a:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1d8)
        ;
      }
      puVar22 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar22) {
        local_2e8 = *puVar22;
        uStack_2e0 = puVar20[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar22;
        local_2f8 = (ulong *)*puVar20;
      }
      local_2f0 = puVar20[1];
      *puVar20 = puVar22;
      puVar20[1] = 0;
      *(undefined1 *)puVar22 = 0;
      getDirSeparator();
      puVar20 = (undefined8 *)
                std::__cxx11::string::_M_replace_aux((ulong)&local_2f8,local_2f0,0,'\x01');
      plVar21 = puVar20 + 2;
      if ((long *)*puVar20 == plVar21) {
        local_288 = *plVar21;
        uStack_280 = puVar20[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *plVar21;
        local_298 = (long *)*puVar20;
      }
      local_290 = puVar20[1];
      *puVar20 = plVar21;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_208,(string *)&local_298);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      puVar25 = local_1e8;
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      std::operator+(&local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     &local_208);
      int32ToStr_abi_cxx11_(&local_278,&mplsOffset);
      strPadLeft(&local_2d8,&local_278,5,'0');
      uVar28 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        uVar28 = local_2b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar28 < local_2d8._M_string_length + local_2b8._M_string_length) {
        uVar28 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          uVar28 = local_2d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar28 < local_2d8._M_string_length + local_2b8._M_string_length)
        goto LAB_0017a75f;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
      }
      else {
LAB_0017a75f:
        puVar20 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2b8,(ulong)local_2d8._M_dataplus._M_p);
      }
      puVar22 = puVar20 + 2;
      if ((ulong *)*puVar20 == puVar22) {
        local_2e8 = *puVar22;
        uStack_2e0 = puVar20[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar22;
        local_2f8 = (ulong *)*puVar20;
      }
      local_2f0 = puVar20[1];
      *puVar20 = puVar22;
      puVar20[1] = 0;
      *(undefined1 *)puVar22 = 0;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,".mpls","");
      uVar29 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar29 = local_2e8;
      }
      if (uVar29 < local_250 + local_2f0) {
        uVar29 = 0xf;
        if (local_258 != local_248) {
          uVar29 = local_248[0];
        }
        if (uVar29 < local_250 + local_2f0) goto LAB_0017a823;
        puVar20 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_0017a823:
        puVar20 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_258)
        ;
      }
      plVar21 = puVar20 + 2;
      if ((long *)*puVar20 == plVar21) {
        local_288 = *plVar21;
        uStack_280 = puVar20[3];
        local_298 = &local_288;
      }
      else {
        local_288 = *plVar21;
        local_298 = (long *)*puVar20;
      }
      local_290 = puVar20[1];
      *puVar20 = plVar21;
      puVar20[1] = 0;
      *(undefined1 *)plVar21 = 0;
      iVar14 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[2])
                         (this_00,local_298,2,0);
      if (local_298 != &local_288) {
        operator_delete(local_298,local_288 + 1);
      }
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar14 == '\0') goto LAB_0017a978;
      iVar14 = (int)local_230;
      iVar15 = (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[5])
                         (this_00,puVar25,(ulong)local_230 & 0xffffffff);
      p_Var24 = (this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[3];
      if (iVar15 == iVar14) {
        bVar26 = true;
        (*p_Var24)(this_00);
        goto LAB_0017a97a;
      }
    }
    (*p_Var24)(this_00);
  }
LAB_0017a978:
  bVar26 = false;
LAB_0017a97a:
  operator_delete__(puVar25);
  (*(this_00->super_AbstractOutputStream).super_AbstractStream._vptr_AbstractStream[1])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&local_1b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_e8[0] != (pointer)0x0) {
    operator_delete(local_e8[0],(long)local_d8 - (long)local_e8[0]);
  }
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_100);
  std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector(&local_118);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector
            ((vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_> *)(local_150 + 0x20));
  return bVar26;
code_r0x00179b70:
  p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
  goto LAB_00179b57;
}

Assistant:

bool BlurayHelper::createMPLSFile(TSMuxer* mainMuxer, TSMuxer* subMuxer, int autoChapterLen,
                                  const vector<double>& customChapters, DiskType dt, int mplsOffset,
                                  bool isMvcBaseViewR) const
{
    int64_t firstPts = *(mainMuxer->getFirstPts().begin());
    int64_t lastPts = *(mainMuxer->getLastPts().rbegin());

    int bufSize = 1024 * 100;
    auto mplsBuffer = new uint8_t[bufSize];
    MPLSParser mplsParser;
    mplsParser.m_m2tsOffset = mainMuxer->getFirstFileNum();
    mplsParser.PlayList_playback_type = 1;
    mplsParser.ref_to_STC_id = 0;
    mplsParser.IN_time = static_cast<uint32_t>(firstPts / 2);
    mplsParser.OUT_time = static_cast<uint32_t>(lastPts / 2);
    mplsParser.mvc_base_view_r = isMvcBaseViewR;

    if (customChapters.empty())
    {
        mplsParser.m_chapterLen = autoChapterLen;
    }
    else
    {
        for (auto& i : customChapters)
        {
            auto mark = static_cast<uint32_t>(i * 45000.0);
            if (mark <= (mplsParser.OUT_time - mplsParser.IN_time))
                mplsParser.m_marks.emplace_back(-1, mark + mplsParser.IN_time);
        }
    }
    mplsParser.PlayItem_random_access_flag = false;
    PIDListMap pidList = mainMuxer->getPidList();
    PIDListMap pidListMVC;
    if (subMuxer)
        pidListMVC = subMuxer->getPidList();

    for (auto& [index, si] : pidList)
    {
        mplsParser.m_streamInfo.emplace_back(si);
        MPLSStreamInfo& info = *mplsParser.m_streamInfo.rbegin();
        auto pgStream = dynamic_cast<PGSStreamReader*>(si.m_codecReader);
        if (pgStream)
        {
            info.offsetId = pgStream->getOffsetId();
            info.SS_PG_offset_sequence_id = pgStream->ssPGOffset;
            info.isSSPG = pgStream->isSSPG;
            if (info.isSSPG)
            {
                bool isSecondary = false;
                const PMTStreamInfo* left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidList);
                if (!left)
                {
                    left = streamByIndex(pgStream->leftEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (left)
                {
                    info.leftEye = new MPLSStreamInfo(*left);
                    if (isSecondary)
                        info.leftEye->type = 2;  // ref to subclip
                }

                isSecondary = false;
                const PMTStreamInfo* right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidList);
                if (!right)
                {
                    right = streamByIndex(pgStream->rightEyeSubStreamIdx, pidListMVC);
                    isSecondary = true;
                }
                if (right)
                {
                    info.rightEye = new MPLSStreamInfo(*right);
                    if (isSecondary)
                        info.rightEye->type = 2;  // ref to subclip
                }
            }
        }
    }
    if (subMuxer)
    {
        mplsParser.isDependStreamExist = true;
        for (const auto& [pid, si] : pidListMVC)
        {
            MPLSStreamInfo data(si);
            data.type = 2;  // Identify an elementary stream of the Clip used by a SubPath with SubPath_type set to
                            // 2,3,4,5,6,8 or 9
            mplsParser.m_streamInfoMVC.push_back(data);
        }
    }

    if (dt == DiskType::BLURAY)
    {
        LTRACE(LT_INFO, 2, "Creating Blu-ray playlist");
    }
    else
    {
        LTRACE(LT_INFO, 2, "Creating AVCHD playlist");
    }
    int fileLen = mplsParser.compose(mplsBuffer, bufSize, dt);

    string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    string dstDir = string("BDMV") + getDirSeparator() + string("PLAYLIST") + getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();

    dstDir = string("BDMV") + getDirSeparator() + string("BACKUP") + getDirSeparator() + string("PLAYLIST") +
             getDirSeparator();
    if (!file->open((prefix + dstDir + strPadLeft(int32ToStr(mplsOffset), 5, '0') + string(".mpls")).c_str(),
                    File::ofWrite))
    {
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    if (file->write(mplsBuffer, fileLen) != fileLen)
    {
        file->close();
        delete[] mplsBuffer;
        delete file;
        return false;
    }
    file->close();
    delete[] mplsBuffer;
    delete file;
    return true;
}